

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

IDiagObjectModelDisplay * __thiscall Js::ResolvedObject::CreateDisplay(ResolvedObject *this)

{
  Var aValue;
  bool bVar1;
  ReferencedArenaAdapter *pRVar2;
  RecyclableObjectDisplay *this_00;
  JavascriptCopyOnAccessNativeIntArray *this_01;
  ArenaAllocator *pAVar3;
  
  pRVar2 = DebugManager::GetDiagnosticArena(this->scriptContext->threadContext->debugManager);
  bVar1 = VarIs<Js::TypedArrayBase>(this->obj);
  if (bVar1) {
    pAVar3 = (ArenaAllocator *)0x0;
    if (pRVar2->deleteFlag == false) {
      pAVar3 = pRVar2->arena;
    }
    this_00 = (RecyclableObjectDisplay *)new<Memory::ArenaAllocator>(0x38,pAVar3,0x364470);
    RecyclableTypedArrayDisplay::RecyclableTypedArrayDisplay
              ((RecyclableTypedArrayDisplay *)this_00,this);
  }
  else {
    bVar1 = VarIs<Js::ES5Array>(this->obj);
    if (bVar1) {
      pAVar3 = (ArenaAllocator *)0x0;
      if (pRVar2->deleteFlag == false) {
        pAVar3 = pRVar2->arena;
      }
      this_00 = (RecyclableObjectDisplay *)new<Memory::ArenaAllocator>(0x38,pAVar3,0x364470);
      RecyclableES5ArrayDisplay::RecyclableES5ArrayDisplay
                ((RecyclableES5ArrayDisplay *)this_00,this);
    }
    else {
      bVar1 = JavascriptArray::IsNonES5Array(this->obj);
      if (bVar1) {
        aValue = this->obj;
        if (aValue != (Var)0x0) {
          bVar1 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(aValue);
          if (bVar1) {
            this_01 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(aValue);
            if (this_01 != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
              JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this_01);
            }
          }
        }
        pAVar3 = (ArenaAllocator *)0x0;
        if (pRVar2->deleteFlag == false) {
          pAVar3 = pRVar2->arena;
        }
        this_00 = (RecyclableObjectDisplay *)new<Memory::ArenaAllocator>(0x38,pAVar3,0x364470);
        RecyclableArrayDisplay::RecyclableArrayDisplay((RecyclableArrayDisplay *)this_00,this);
      }
      else {
        pAVar3 = (ArenaAllocator *)0x0;
        if (pRVar2->deleteFlag == false) {
          pAVar3 = pRVar2->arena;
        }
        this_00 = (RecyclableObjectDisplay *)new<Memory::ArenaAllocator>(0x38,pAVar3,0x364470);
        RecyclableObjectDisplay::RecyclableObjectDisplay(this_00,this,0);
      }
    }
  }
  if ((this->isConst != false) || ((this->propId & 0xfffffffeU) == 0x2d6)) {
    (*(((RecyclableObjectDisplay *)&this_00->super_IDiagObjectModelDisplay)->
      super_IDiagObjectModelDisplay)._vptr_IDiagObjectModelDisplay[6])(this_00,0x800);
  }
  return &this_00->super_IDiagObjectModelDisplay;
}

Assistant:

IDiagObjectModelDisplay * ResolvedObject::CreateDisplay()
    {
        IDiagObjectModelDisplay* pOMDisplay = nullptr;
        ReferencedArenaAdapter* pRefArena = scriptContext->GetThreadContext()->GetDebugManager()->GetDiagnosticArena();

        if (Js::VarIs<Js::TypedArrayBase>(obj))
        {
            pOMDisplay = Anew(pRefArena->Arena(), RecyclableTypedArrayDisplay, this);
        }
        else if (Js::VarIs<Js::ES5Array>(obj))
        {
            pOMDisplay = Anew(pRefArena->Arena(), RecyclableES5ArrayDisplay, this);
        }
        else if (Js::JavascriptArray::IsNonES5Array(obj))
        {
            // DisableJIT-TODO: Review- is this correct?
#if ENABLE_COPYONACCESS_ARRAY
            // Make sure any NativeIntArrays are converted
            Js::JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(obj);
#endif
            pOMDisplay = Anew(pRefArena->Arena(), RecyclableArrayDisplay, this);
        }
        else
        {
            pOMDisplay = Anew(pRefArena->Arena(), RecyclableObjectDisplay, this);
        }

        if (this->isConst || this->propId == Js::PropertyIds::_super || this->propId == Js::PropertyIds::_superConstructor)
        {
            pOMDisplay->SetDefaultTypeAttribute(DBGPROP_ATTRIB_VALUE_READONLY);
        }

        return pOMDisplay;
    }